

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFramebufferDefaultStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FramebufferTest::iterate(FramebufferTest *this)

{
  int iVar1;
  deUint32 framebuffer;
  GLenum err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  ScopedLogSection local_128;
  ScopedLogSection section_1;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  ScopedLogSection local_d0;
  ScopedLogSection section;
  string local_c0;
  undefined1 local_a0 [8];
  ResultCollector result;
  undefined1 local_40 [8];
  CallLogWrapper gl;
  Framebuffer fbo;
  FramebufferTest *this_local;
  
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&gl.m_enableLog,pRVar2);
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_40,(Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0," // ERROR: ",(allocator<char> *)((long)&section.m_log + 7));
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_a0,pTVar3,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_40,true);
  framebuffer = glu::ObjectWrapper::operator*((ObjectWrapper *)&gl.m_enableLog);
  glu::CallLogWrapper::glBindFramebuffer((CallLogWrapper *)local_40,0x8ca9,framebuffer);
  err = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_40);
  glu::checkError(err,"bind",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFramebufferDefaultStateQueryTests.cpp"
                  ,0x52);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Initial",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_d0,pTVar3,&local_f0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,local_a0,local_40);
  tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"Set",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Set",&local_171);
  tcu::ScopedLogSection::ScopedLogSection(&local_128,pTVar3,&local_148,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this,local_a0,local_40);
  tcu::ScopedLogSection::~ScopedLogSection(&local_128);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_a0,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_a0);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_40);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&gl.m_enableLog);
  return STOP;
}

Assistant:

FramebufferTest::IterateResult FramebufferTest::iterate (void)
{
	glu::Framebuffer		fbo		(m_context.getRenderContext());
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		checkInitial(result, gl);
	}

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Set", "Set");
		checkSet(result, gl);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}